

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::readResultTextures(SRGBTestCase *this)

{
  RenderContext *context;
  int iVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar4;
  long lVar5;
  PixelBufferAccess local_58;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar1 = *(int *)CONCAT44(extraout_var_00,iVar1);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)(CONCAT44(extraout_var_01,iVar2) + 4);
  (**(code **)(lVar3 + 0x78))
            (0x8d40,(((this->m_framebuffer).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::resize
            (&this->m_textureResultList,
             (long)(this->m_renderBufferList).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_renderBufferList).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  if ((this->m_renderBufferList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_renderBufferList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      (**(code **)(lVar3 + 0x1218))((int)uVar4 + 0x8ce0);
      tcu::TextureLevel::setStorage
                ((TextureLevel *)
                 ((long)(((this->m_textureResultList).
                          super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar5 + -8),
                 &this->m_resultTextureFormat,iVar1,iVar2,1);
      context = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::TextureLevel::getAccess
                (&local_58,
                 (TextureLevel *)
                 ((long)(((this->m_textureResultList).
                          super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar5 + -8));
      glu::readPixels(context,0,0,&local_58);
      err = (**(code **)(lVar3 + 0x800))();
      glu::checkError(err,"glReadPixels()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                      ,0x4be);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x28;
    } while (uVar4 < (ulong)((long)(this->m_renderBufferList).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_renderBufferList).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  (**(code **)(lVar3 + 0x78))(0x8d40,0);
  return;
}

Assistant:

void SRGBTestCase::readResultTextures (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	int						width	= m_context.getRenderContext().getRenderTarget().getWidth();
	int						height	= m_context.getRenderContext().getRenderTarget().getHeight();

	gl.bindFramebuffer(GL_FRAMEBUFFER, **m_framebuffer);

	m_textureResultList.resize(m_renderBufferList.size());

	for (std::size_t renderBufferIdx = 0; renderBufferIdx < m_renderBufferList.size(); renderBufferIdx++)
	{
		gl.readBuffer(GL_COLOR_ATTACHMENT0 + (glw::GLenum)renderBufferIdx);
		m_textureResultList[renderBufferIdx].setStorage(m_resultTextureFormat, width, height);
		glu::readPixels(m_context.getRenderContext(), 0, 0, m_textureResultList[renderBufferIdx].getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
}